

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O3

char * __thiscall cali::Attribute::name_c_str(Attribute *this)

{
  char *pcVar1;
  Node *pNVar2;
  cali_variant_t local_18;
  
  pNVar2 = this->m_node;
  if (pNVar2 == (Node *)0x0) {
    return (char *)0x0;
  }
  do {
    if (pNVar2->m_attribute == 8) {
      local_18.type_and_size = (pNVar2->m_data).m_v.type_and_size;
      local_18.value = (pNVar2->m_data).m_v.value;
      pcVar1 = (char *)cali_variant_get_data(&local_18);
      return pcVar1;
    }
    pNVar2 = *(Node **)((long)&(((pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                               super_LockfreeIntrusiveTree<cali::Node>).m_me +
                       (pNVar2->super_LockfreeIntrusiveTree<cali::Node>).m_node);
  } while (pNVar2 != (Node *)0x0);
  return (char *)0x0;
}

Assistant:

const char* Attribute::name_c_str() const
{
    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == NAME_ATTR_ID)
            return static_cast<const char*>(node->data().data());

    return nullptr;
}